

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

string * adios2sys::SystemTools::CapitalizedWords(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  int iVar2;
  int __c;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + s->_M_string_length);
  if (s->_M_string_length != 0) {
    uVar3 = 0;
    do {
      pcVar1 = (s->_M_dataplus)._M_p;
      __c = (int)pcVar1[uVar3];
      iVar2 = isalpha(__c);
      if (iVar2 != 0) {
        if (uVar3 != 0) {
          iVar2 = isspace((int)pcVar1[uVar3 - 1]);
          if (iVar2 == 0) goto LAB_0072e4d9;
        }
        iVar2 = toupper(__c);
        (__return_storage_ptr__->_M_dataplus)._M_p[uVar3] = (char)iVar2;
      }
LAB_0072e4d9:
      uVar3 = uVar3 + 1;
    } while (uVar3 < s->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::CapitalizedWords(const std::string& s)
{
  std::string n(s);
  for (size_t i = 0; i < s.size(); i++) {
#if defined(_MSC_VER) && defined(_MT) && defined(_DEBUG)
    // MS has an assert that will fail if s[i] < 0; setting
    // LC_CTYPE using setlocale() does *not* help. Painful.
    if ((int)s[i] >= 0 && isalpha(s[i]) &&
        (i == 0 || ((int)s[i - 1] >= 0 && isspace(s[i - 1]))))
#else
    if (isalpha(s[i]) && (i == 0 || isspace(s[i - 1])))
#endif
    {
      n[i] = static_cast<std::string::value_type>(toupper(s[i]));
    }
  }
  return n;
}